

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O2

void __thiscall
nigel::Linker::printToFile
          (Linker *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,path *file)

{
  char cVar1;
  pointer puVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  u8 uVar6;
  uint uVar7;
  ulong uVar8;
  String out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  String fileStr;
  ofstream filestream;
  byte abStack_210 [480];
  
  std::__cxx11::string::string((string *)&fileStr,"",(allocator *)&filestream);
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  uVar7 = 0;
  cVar1 = '\0';
  uVar8 = 0;
  while( true ) {
    puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    cVar4 = (char)(uVar7 & 0xffff);
    cVar3 = (char)((uVar7 & 0xffff) >> 8);
    if ((ulong)((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <= uVar8) break;
    helper::int_to_hex<unsigned_char>((string *)&filestream,puVar2[uVar8]);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::~string((string *)&filestream);
    cVar1 = cVar1 + (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar8];
    if (0x1f < out._M_string_length) {
      uVar6 = (u8)(out._M_string_length >> 1);
      helper::int_to_hex<unsigned_char>(&local_2d0,uVar6);
      std::operator+(&local_350,":",&local_2d0);
      helper::int_to_hex<unsigned_short>(&local_2f0,(unsigned_short)uVar7);
      std::operator+(&local_2b0,&local_350,&local_2f0);
      std::operator+(&local_290,&local_2b0,"00");
      std::operator+(&local_330,&local_290,&out);
      helper::int_to_hex<unsigned_char>(&local_310,-(cVar1 + uVar6 + cVar3 + cVar4));
      std::operator+(&local_270,&local_330,&local_310);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &filestream,&local_270,"\r\n");
      std::__cxx11::string::append((string *)&fileStr);
      std::__cxx11::string::~string((string *)&filestream);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_2d0);
      uVar5 = (uint)out._M_string_length;
      std::__cxx11::string::assign((char *)&out);
      uVar7 = uVar7 + (uVar5 >> 1);
      cVar1 = '\0';
    }
    uVar8 = uVar8 + 1;
  }
  if (out._M_string_length != 0) {
    uVar6 = (u8)(out._M_string_length >> 1);
    helper::int_to_hex<unsigned_char>(&local_2d0,uVar6);
    std::operator+(&local_350,":",&local_2d0);
    helper::int_to_hex<unsigned_short>(&local_2f0,(unsigned_short)uVar7);
    std::operator+(&local_2b0,&local_350,&local_2f0);
    std::operator+(&local_290,&local_2b0,"00");
    std::operator+(&local_330,&local_290,&out);
    helper::int_to_hex<unsigned_char>(&local_310,-(cVar1 + cVar3 + cVar4 + uVar6));
    std::operator+(&local_270,&local_330,&local_310);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filestream,
                   &local_270,"\r\n");
    std::__cxx11::string::append((string *)&fileStr);
    std::__cxx11::string::~string((string *)&filestream);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  std::__cxx11::string::append((char *)&fileStr);
  std::ofstream::ofstream(&filestream,(string *)file,_S_bin);
  if ((abStack_210[*(long *)(_filestream + -0x18)] & 5) == 0) {
    std::operator<<((ostream *)&filestream,fileStr._M_dataplus._M_p);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&filestream);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&fileStr);
  return;
}

Assistant:

void Linker::printToFile( const std::vector<u8>& data, fs::path file )
	{
		String fileStr = "";
		String out;
		u16 startAddr = 0;
		u16 checksum = 0;
		for( size_t i = 0 ; i < data.size() ; i++ )
		{
			out += int_to_hex( data[i] );
			checksum += data[i];

			if( out.size() >= 32 )
			{
				checksum += ( out.size() / 2 ) + ( startAddr & 0xff ) + ( startAddr >> 8 );
				fileStr += ":" + int_to_hex( static_cast< u8 >( out.size() / 2 ) ) + int_to_hex( startAddr ) + "00" + out + int_to_hex( static_cast< u8 >( ~( checksum % 256 )+1 ) ) + "\r\n";
				checksum = 0;
				startAddr += static_cast< u16 >( out.size() / 2 );
				out = "";
            }
		}
		if( out.size() > 0 )
		{
			checksum += ( out.size() / 2 ) + ( startAddr & 0xff ) + ( startAddr >> 8 );
			fileStr += ":" + int_to_hex( static_cast< u8 >( out.size() / 2 ) ) + int_to_hex( startAddr ) + "00" + out + int_to_hex( static_cast< u8 >( ~( checksum % 256 )+1 ) ) + "\r\n";
		}
		fileStr += ":00000001FF";


		std::ofstream filestream( file.string(), std::ios_base::binary );

		if( filestream )
		{
			filestream << fileStr.c_str();
			filestream.close();
		}
	}